

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_revision.cpp
# Opt level: O1

void __thiscall RevisionsFixture_InitNothing_Test::TestBody(RevisionsFixture_InitNothing_Test *this)

{
  type *ptVar1;
  char *message;
  AssertionResult gtest_ar;
  revisions_type expected;
  revisions_type actual;
  undefined1 local_50 [4];
  type local_4c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_48;
  pair<unsigned_int,_pstore::maybe<unsigned_int,_void>_> local_3c;
  Message local_30;
  AssertHelper local_28;
  revisions_type local_1c;
  
  local_50[0] = (internal)0x1;
  local_4c = (type)0x7;
  local_3c.first = 8;
  local_3c.second.valid_ = false;
  ptVar1 = (type *)pstore::maybe<unsigned_int,_void>::operator->
                             ((maybe<unsigned_int,_void> *)local_50);
  local_3c.second.storage_ = *ptVar1;
  local_3c.second.valid_ = true;
  local_50 = (undefined1  [4])0xffffffff;
  local_4c.__data = local_4c.__data & 0xffffff00;
  pstore::diff_dump::update_revisions(&local_1c,(revisions_type *)local_50,8);
  if (local_4c.__data[0] == '\x01') {
    local_4c.__data = local_4c.__data & 0xffffff00;
  }
  testing::internal::
  CmpHelperEQ<std::pair<unsigned_int,pstore::maybe<unsigned_int,void>>,std::pair<unsigned_int,pstore::maybe<unsigned_int,void>>>
            ((internal *)local_50,"expected","actual",&local_3c,&local_1c);
  if (local_50[0] == (internal)0x0) {
    testing::Message::Message(&local_30);
    if (local_48 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = (local_48->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_28,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/diff/test_revision.cpp"
               ,0x2f,message);
    testing::internal::AssertHelper::operator=(&local_28,&local_30);
    testing::internal::AssertHelper::~AssertHelper(&local_28);
    if (local_30.ss_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl !=
        (__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
         )0x0) {
      (**(code **)(*(long *)local_30.ss_._M_t.
                            super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                            ._M_head_impl + 8))();
    }
  }
  if (local_48 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_48,local_48);
  }
  return;
}

Assistant:

TEST_F (RevisionsFixture, InitNothing) {
    diff_dump::revisions_type const expected =
        this->expected_revisions (db_head_revision, db_head_revision - 1);
    diff_dump::revisions_type const actual = diff_dump::update_revisions (
        std::make_pair (head_revision, nothing<revision_number> ()), db_head_revision);

    EXPECT_EQ (expected, actual);
}